

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * declaration(C_Parser *parser,C_Token **rest,C_Token *tok,C_Type *basety,VarAttr *attr)

{
  _Bool _Var1;
  C_Type *pCVar2;
  char *pcVar3;
  C_Obj *pCVar4;
  undefined8 *val;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  C_Node *pCVar9;
  C_Token *pCVar10;
  C_Node *pCVar11;
  C_Node head;
  C_Token *local_190;
  VarAttr *local_188;
  undefined8 *local_180;
  C_Node *local_178;
  C_Token **local_170;
  C_Token *local_168;
  C_Type *local_160;
  undefined8 local_158;
  C_Node *pCStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  local_158 = 0;
  pCStack_150 = (C_Node *)0x0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  local_190 = tok;
  local_170 = rest;
  local_160 = basety;
  _Var1 = C_equal(tok,";");
  pCVar9 = (C_Node *)0x0;
  pCVar11 = pCVar9;
  if (!_Var1) {
    puVar8 = &local_158;
    local_188 = attr;
    do {
      pCVar11 = (C_Node *)(ulong)((int)pCVar9 - 1);
      if ((int)pCVar9 != 0) {
        local_190 = C_skip(parser,local_190,",");
      }
      pCVar2 = declarator(parser,&local_190,local_190,local_160);
      pCVar10 = local_190;
      if (pCVar2->kind == TY_VOID) {
LAB_0012c123:
        pcVar3 = "variable declared void";
LAB_0012c145:
        C_error_tok(parser,pCVar10,pcVar3);
      }
      if (pCVar2->name == (C_Token *)0x0) {
        pCVar10 = pCVar2->name_pos;
        pcVar3 = "variable name omitted";
        goto LAB_0012c145;
      }
      if ((attr == (VarAttr *)0x0) || (attr->is_static != true)) {
        local_178 = pCVar11;
        pCVar9 = compute_vla_size(parser,pCVar2,local_190);
        pCVar10 = local_190;
        local_180 = (undefined8 *)
                    (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
        *(undefined4 *)local_180 = 0x26;
        local_180[3] = pCVar10;
        local_180[4] = pCVar9;
        puVar8[1] = local_180;
        if (pCVar2->kind == TY_VLA) {
          _Var1 = C_equal(local_190,"=");
          if (_Var1) {
            pcVar3 = "variable-sized object may not be initialized";
            pCVar10 = local_190;
            goto LAB_0012c145;
          }
          pcVar3 = get_ident(parser,pCVar2->name);
          pCVar4 = new_var(parser,pcVar3,pCVar2);
          pCVar4->is_local = true;
          pCVar4->next = parser->locals;
          parser->locals = pCVar4;
          pCVar10 = pCVar2->name;
          puVar5 = (undefined4 *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          *puVar5 = 0x29;
          *(C_Token **)(puVar5 + 6) = pCVar10;
          *(C_Obj **)(puVar5 + 0x40) = pCVar4;
          pCVar4 = pCVar2->vla_size;
          pCVar9 = (C_Node *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          pCVar9->kind = ND_VAR;
          pCVar9->tok = pCVar10;
          pCVar9->var = pCVar4;
          pCVar4 = parser->builtin_alloca;
          local_168 = pCVar10;
          puVar6 = (undefined4 *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          *puVar6 = 0x28;
          *(C_Token **)(puVar6 + 6) = pCVar10;
          *(C_Obj **)(puVar6 + 0x40) = pCVar4;
          pCVar10 = pCVar9->tok;
          puVar7 = (undefined4 *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          *puVar7 = 0x25;
          *(C_Token **)(puVar7 + 6) = pCVar10;
          *(undefined4 **)(puVar7 + 8) = puVar6;
          pCVar2 = parser->builtin_alloca->ty;
          *(C_Type **)(puVar7 + 0x1e) = pCVar2;
          *(C_Type **)(puVar7 + 4) = pCVar2->return_ty;
          *(C_Node **)(puVar7 + 0x20) = pCVar9;
          C_add_type(parser,pCVar9);
          puVar6 = (undefined4 *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          pCVar10 = local_168;
          *puVar6 = 0x10;
          *(C_Token **)(puVar6 + 6) = local_168;
          *(undefined4 **)(puVar6 + 8) = puVar5;
          *(undefined4 **)(puVar6 + 10) = puVar7;
          puVar8 = (undefined8 *)
                   (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
          *(undefined4 *)puVar8 = 0x26;
          puVar8[3] = pCVar10;
          puVar8[4] = puVar6;
          local_180[1] = puVar8;
          attr = local_188;
          pCVar9 = local_178;
        }
        else {
          pcVar3 = get_ident(parser,pCVar2->name);
          pCVar4 = new_var(parser,pcVar3,pCVar2);
          pCVar4->is_local = true;
          pCVar4->next = parser->locals;
          parser->locals = pCVar4;
          if ((attr != (VarAttr *)0x0) && (attr->align != 0)) {
            pCVar4->align = attr->align;
          }
          _Var1 = C_equal(local_190,"=");
          puVar8 = local_180;
          if (_Var1) {
            pCVar9 = lvar_initializer(parser,&local_190,local_190->next,pCVar4);
            pCVar10 = local_190;
            puVar8 = (undefined8 *)
                     (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
            *(undefined4 *)puVar8 = 0x26;
            puVar8[3] = pCVar10;
            puVar8[4] = pCVar9;
            local_180[1] = puVar8;
            attr = local_188;
          }
          if (pCVar4->ty->size < 0) {
            pCVar10 = pCVar2->name;
            pcVar3 = "variable has incomplete type";
            goto LAB_0012c145;
          }
          pCVar9 = local_178;
          if (pCVar4->ty->kind == TY_VOID) {
            pCVar10 = pCVar2->name;
            goto LAB_0012c123;
          }
        }
      }
      else {
        pcVar3 = new_unique_name(parser->memory_allocator);
        pCVar4 = new_var(parser,pcVar3,pCVar2);
        pCVar4->next = parser->globals;
        pCVar4->is_definition = true;
        pCVar4->is_static = true;
        parser->globals = pCVar4;
        pcVar3 = get_ident(parser,pCVar2->name);
        val = (undefined8 *)
              (*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x20);
        hashmap_put(&parser->scope->vars,pcVar3,val);
        *val = pCVar4;
        _Var1 = C_equal(local_190,"=");
        attr = local_188;
        pCVar9 = pCVar11;
        if (_Var1) {
          gvar_initializer(parser,&local_190,local_190->next,pCVar4);
          attr = local_188;
        }
      }
      _Var1 = C_equal(local_190,";");
      tok = local_190;
      pCVar11 = pCStack_150;
    } while (!_Var1);
  }
  pCVar9 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
  pCVar9->kind = ND_BLOCK;
  pCVar9->tok = tok;
  pCVar9->body = pCVar11;
  *local_170 = local_190->next;
  return pCVar9;
}

Assistant:

static C_Node *declaration(C_Parser *parser, C_Token **rest, C_Token *tok, C_Type *basety, VarAttr *attr) {
  C_Node head = {0};
  C_Node *cur = &head;
  int i = 0;

  while (!C_equal(tok, ";")) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    C_Type *ty = declarator(parser, &tok, tok, basety);
    if (ty->kind == TY_VOID)
      C_error_tok(parser, tok, "variable declared void");
    if (!ty->name)
      C_error_tok(parser, ty->name_pos, "variable name omitted");

    if (attr && attr->is_static) {
      // static local variable
      C_Obj *var = new_anon_gvar(parser, ty);
      push_scope(parser, get_ident(parser, ty->name))->var = var;
      if (C_equal(tok, "="))
        gvar_initializer(parser, &tok, tok->next, var);
      continue;
    }

    // Generate code for computing a VLA size. We need to do this
    // even if ty is not VLA because ty may be a pointer to VLA
    // (e.g. int (*foo)[n][m] where n and m are variables.)
    cur = cur->next = new_unary(parser, ND_EXPR_STMT, compute_vla_size(parser, ty, tok), tok);

    if (ty->kind == TY_VLA) {
      if (C_equal(tok, "="))
        C_error_tok(parser, tok, "variable-sized object may not be initialized");

      // Variable length arrays (VLAs) are translated to alloca() calls.
      // For example, `int x[n+2]` is translated to `tmp = n + 2,
      // x = alloca(tmp)`.
      C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
      C_Token *tok = ty->name;
      C_Node *expr = new_binary(parser, ND_ASSIGN, new_vla_ptr(parser, var, tok),
                              new_alloca(parser, new_var_node(parser, ty->vla_size, tok)),
                              tok);

      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
      continue;
    }

    C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
    if (attr && attr->align)
      var->align = attr->align;

    if (C_equal(tok, "=")) {
      C_Node *expr = lvar_initializer(parser, &tok, tok->next, var);
      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
    }

    if (var->ty->size < 0)
      C_error_tok(parser, ty->name, "variable has incomplete type");
    if (var->ty->kind == TY_VOID)
      C_error_tok(parser, ty->name, "variable declared void");
  }

  C_Node *node = new_node(parser, ND_BLOCK, tok);
  node->body = head.next;
  *rest = tok->next;
  return node;
}